

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

string * __thiscall
ObjectModelBuilder::uniqueIdentifier
          (string *__return_storage_ptr__,ObjectModelBuilder *this,Class *clazz,string *id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  allocator local_19;
  
  if (id->_M_string_length == 0) {
    this->m_unnamedCounter = this->m_unnamedCounter + 1;
    std::__cxx11::string::string((string *)&local_60,"unnamable",&local_19);
    std::__cxx11::to_string(&local_40,this->m_unnamedCounter);
    std::operator+(__return_storage_ptr__,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)id);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectModelBuilder::uniqueIdentifier(Class *clazz, const std::string &id)
{
    if (id.empty()) {
        ++m_unnamedCounter;
        return std::string("unnamable") + std::to_string(m_unnamedCounter);
    }
    return id;
}